

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.c
# Opt level: O1

void InitShader(uint32_t *shaderId,char *vertexSrc,char *fragmentSrc)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLint isCompiled;
  GLchar *source;
  GLint isLinked;
  GLint local_4c;
  GLuint *local_48;
  char *local_40;
  GLint local_34;
  
  local_48 = shaderId;
  GVar1 = (*glad_glCreateShader)(0x8b31);
  local_40 = vertexSrc;
  (*glad_glShaderSource)(GVar1,1,&local_40,(GLint *)0x0);
  (*glad_glCompileShader)(GVar1);
  local_4c = 0;
  (*glad_glGetShaderiv)(GVar1,0x8b81,&local_4c);
  if (local_4c == 0) {
    InitShader_cold_3();
  }
  else {
    GVar2 = (*glad_glCreateShader)(0x8b30);
    local_40 = fragmentSrc;
    (*glad_glShaderSource)(GVar2,1,&local_40,(GLint *)0x0);
    (*glad_glCompileShader)(GVar2);
    (*glad_glGetShaderiv)(GVar2,0x8b81,&local_4c);
    if (local_4c == 0) {
      InitShader_cold_2();
    }
    else {
      GVar3 = (*glad_glCreateProgram)();
      *local_48 = GVar3;
      (*glad_glAttachShader)(GVar3,GVar1);
      (*glad_glAttachShader)(GVar3,GVar2);
      (*glad_glLinkProgram)(GVar3);
      local_34 = 0;
      (*glad_glGetProgramiv)(GVar3,0x8b82,&local_34);
      if (local_34 == 0) {
        InitShader_cold_1();
      }
      else {
        (*glad_glDetachShader)(GVar3,GVar1);
        (*glad_glDetachShader)(GVar3,GVar2);
      }
    }
  }
  return;
}

Assistant:

void InitShader(uint32_t * shaderId, const char* vertexSrc, const char* fragmentSrc) {
    // Create an empty vertex shader handle
    GLuint vertexShader = glCreateShader(GL_VERTEX_SHADER);

// Send the vertex shader source code to GL
// Note that std::string's .c_str is NULL character terminated.
    const GLchar* source = vertexSrc;
    glShaderSource(vertexShader, 1, &source, 0);

// Compile the vertex shader
    glCompileShader(vertexShader);

    GLint isCompiled = 0;
    glGetShaderiv(vertexShader, GL_COMPILE_STATUS, &isCompiled);
    if (isCompiled == GL_FALSE) {
        GLint maxLength = 0;
        glGetShaderiv(vertexShader, GL_INFO_LOG_LENGTH, &maxLength);

        // The maxLength includes the NULL character
        char * infoLog = malloc(sizeof(char) * maxLength);
        glGetShaderInfoLog(vertexShader, maxLength, &maxLength, infoLog);

        // We don't need the shader anymore.
        glDeleteShader(vertexShader);

        // Use the infoLog as you see fit.

        // In this simple program, we'll just leave
        fprintf(stderr, "%s", infoLog);
        fprintf(stderr, "Vertex shader compilation failed!\n");
        free(infoLog);
        assert(false);
        return;
    }

// Create an empty fragment shader handle
    GLuint fragmentShader = glCreateShader(GL_FRAGMENT_SHADER);

// Send the fragment shader source code to GL
// Note that std::string's .c_str is NULL character terminated.
    source = (const GLchar*) fragmentSrc;
    glShaderSource(fragmentShader, 1, &source, 0);

// Compile the fragment shader
    glCompileShader(fragmentShader);

    glGetShaderiv(fragmentShader, GL_COMPILE_STATUS, &isCompiled);
    if (isCompiled == GL_FALSE) {
        GLint maxLength = 0;
        glGetShaderiv(fragmentShader, GL_INFO_LOG_LENGTH, &maxLength);

        // The maxLength includes the NULL character
        char * infoLog = malloc(sizeof(char) * maxLength);
        glGetShaderInfoLog(fragmentShader, maxLength, &maxLength, infoLog);

        // We don't need the shader anymore.
        glDeleteShader(fragmentShader);
        // Either of them. Don't leak shaders.
        glDeleteShader(vertexShader);

        // Use the infoLog as you see fit.

        // In this simple program, we'll just leave
        fprintf(stderr, "%s", infoLog);
        fprintf(stderr, "Fragment shader compilation failed!\n");
        free(infoLog);
        assert(false);
        return;
    }

// Vertex and fragment shaders are successfully compiled.
// Now time to link them together into a program.
// Get a program object.
    *shaderId = glCreateProgram();
    GLuint program = *shaderId;

// Attach our shaders to our program
    glAttachShader(program, vertexShader);
    glAttachShader(program, fragmentShader);

// Link our program
    glLinkProgram(program);

// Note the different functions here: glGetProgram* instead of glGetShader*.
    GLint isLinked = 0;
    glGetProgramiv(program, GL_LINK_STATUS, (int*) &isLinked);
    if (isLinked == GL_FALSE) {
        GLint maxLength = 0;
        glGetProgramiv(program, GL_INFO_LOG_LENGTH, &maxLength);

        // The maxLength includes the NULL character
        char * infoLog = malloc(sizeof(char) * maxLength);
        glGetProgramInfoLog(program, maxLength, &maxLength, infoLog);

        // We don't need the program anymore.
        glDeleteProgram(program);
        // Don't leak shaders either.
        glDeleteShader(vertexShader);
        glDeleteShader(fragmentShader);

        // Use the infoLog as you see fit.

        // In this simple program, we'll just leave
        fprintf(stderr, "%s", infoLog);
        fprintf(stderr, "Shader linking failed!\n");
        free(infoLog);
        assert(false);
        return;
    }

// Always detach shaders after a successful link.
    glDetachShader(program, vertexShader);
    glDetachShader(program, fragmentShader);
}